

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-hexfloat.cc
# Opt level: O3

void __thiscall AllFloatsWriteTest::RunShard(AllFloatsWriteTest *this,int shard)

{
  int *piVar1;
  bool bVar2;
  uint bits;
  char *message;
  int iVar4;
  int iVar5;
  uint32_t them_bits;
  AssertionResult gtest_ar;
  char *endptr;
  char buffer [100];
  uint local_c8;
  float local_c4;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c0;
  internal local_b8 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  AssertHelper local_a8;
  char *local_a0;
  char local_98 [104];
  ulong uVar3;
  
  iVar4 = -1;
  uVar3 = (ulong)(uint)shard;
  local_c8 = shard;
  do {
    bits = (uint)uVar3;
    if ((shard == 0) && (iVar5 = (int)(uVar3 >> 0x18), iVar5 != iVar4)) {
      printf("value: 0x%08x (%d%%)\r",uVar3,
             (ulong)(uint)(int)(((double)uVar3 * 100.0) / 4294967295.0));
      fflush(_stdout);
      iVar4 = iVar5;
      bits = local_c8;
    }
    if ((~bits & 0x7f800000) != 0) {
      wabt::WriteFloatHex(local_98,100,bits);
      local_c4 = strtof(local_98,&local_a0);
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                (local_b8,"bits","them_bits",&local_c8,(uint *)&local_c4);
      if (local_b8[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_c0);
        if (local_b0.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          message = "";
        }
        else {
          message = ((local_b0.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_a8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-hexfloat.cc"
                   ,0x87,message);
        testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_c0);
        testing::internal::AssertHelper::~AssertHelper(&local_a8);
        if (((local_c0.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
            (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
           (local_c0.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_c0.ptr_ + 8))();
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        return;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      bits = local_c8;
    }
    piVar1 = &(this->super_ThreadedTest).num_threads_;
    local_c8 = bits + *piVar1;
    uVar3 = (ulong)local_c8;
  } while (!CARRY4(bits,*piVar1));
  if (shard == 0) {
    puts("done.");
    fflush(_stdout);
  }
  return;
}

Assistant:

virtual void RunShard(int shard) {
    char buffer[100];
    FOREACH_UINT32(bits) {
      LOG_COMPLETION(bits);
      if (is_infinity_or_nan(bits))
        continue;

      WriteFloatHex(buffer, sizeof(buffer), bits);

      char* endptr;
      float them_float = strtof(buffer, &endptr);
      uint32_t them_bits = bit_cast<uint32_t>(them_float);
      ASSERT_EQ(bits, them_bits);
    }
    LOG_DONE();
  }